

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySubImage3D::testTexSubImage3D
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLboolean *test_passed)

{
  GLboolean *copy_params_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference data_pointer;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  long local_38;
  Functions *gl;
  GLboolean *test_passed_local;
  SubImage3DCopyParams *copy_params_local;
  GLuint local_18;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArraySubImage3D *this_local;
  
  gl = (Functions *)test_passed;
  test_passed_local = (GLboolean *)copy_params;
  copy_params_local._4_4_ = depth;
  local_18 = height;
  depth_local = width;
  _height_local = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_38 = CONCAT44(extraout_var,iVar2);
  clearCubeMapArrayTexture(this,depth_local,local_18,copy_params_local._4_4_,0);
  copy_params_00 = test_passed_local;
  data_pointer = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_copy_data_buffer,0);
  texSubImage3D(this,(SubImage3DCopyParams *)copy_params_00,data_pointer);
  bVar1 = checkResults(this,depth_local,local_18,copy_params_local._4_4_);
  if (!bVar1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [97])
                        "glTexSubImage3D failed to copy data to texture cube map array\'s data store from client\'s memory\n"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [58])
                               "Texture Cube Map Array Dimensions (width, height, depth) ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2afcbef);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&depth_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_18);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)&copy_params_local + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c1ee60);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [60])
                               "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2afcbef);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)test_passed_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 8));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c1ee60);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [57])
                               "Texture Cube Map Array Copy Size (width, height, depth) ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2afcbef);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 0xc));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 0x10));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 0x14));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c1ee60);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    *(undefined1 *)&gl->activeShaderProgram = 0;
  }
  clearCubeMapArrayTexture(this,depth_local,local_18,copy_params_local._4_4_,0);
  (**(code **)(local_38 + 0x40))(0x88ec,this->m_pixel_buffer_id);
  dVar3 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x1ef);
  texSubImage3D(this,(SubImage3DCopyParams *)test_passed_local,(GLuint *)0x0);
  bVar1 = checkResults(this,depth_local,local_18,copy_params_local._4_4_);
  if (!bVar1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_348,
                        (char (*) [104])
                        "glTexSubImage3D failed to copy data to texture cube map array\'s data store from GL_PIXEL_UNPACK_BUFFER\n"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [58])
                               "Texture Cube Map Array Dimensions (width, height, depth) ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2afcbef);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&depth_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_18);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)&copy_params_local + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c1ee60);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [60])
                               "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2afcbef);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)test_passed_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 8));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c1ee60);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [57])
                               "Texture Cube Map Array Copy Size (width, height, depth) ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2afcbef);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 0xc));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 0x10));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)(test_passed_local + 0x14));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c1ee60);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    *(undefined1 *)&gl->activeShaderProgram = 0;
  }
  (**(code **)(local_38 + 0x40))(0x88ec,0);
  dVar3 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x205);
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::testTexSubImage3D(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
													  const SubImage3DCopyParams& copy_params,
													  glw::GLboolean&			  test_passed)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	clearCubeMapArrayTexture(width, height, depth, 0);

	texSubImage3D(copy_params, &m_copy_data_buffer[0]);

	if (!checkResults(width, height, depth))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "glTexSubImage3D failed to copy data to texture cube map array's data store from client's memory\n"
			<< "Texture Cube Map Array Dimensions (width, height, depth) "
			<< "(" << width << "," << height << "," << depth << ")\n"
			<< "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
			<< "(" << copy_params.m_xoffset << "," << copy_params.m_yoffset << "," << copy_params.m_zoffset << ")\n"
			<< "Texture Cube Map Array Copy Size (width, height, depth) "
			<< "(" << copy_params.m_width << "," << copy_params.m_height << "," << copy_params.m_depth << ")\n"
			<< tcu::TestLog::EndMessage;

		test_passed = false;
	}

	clearCubeMapArrayTexture(width, height, depth, 0);

	gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_pixel_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	texSubImage3D(copy_params, 0);

	if (!checkResults(width, height, depth))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexSubImage3D failed to copy data to texture cube map "
													   "array's data store from GL_PIXEL_UNPACK_BUFFER\n"
						   << "Texture Cube Map Array Dimensions (width, height, depth) "
						   << "(" << width << "," << height << "," << depth << ")\n"
						   << "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
						   << "(" << copy_params.m_xoffset << "," << copy_params.m_yoffset << ","
						   << copy_params.m_zoffset << ")\n"
						   << "Texture Cube Map Array Copy Size (width, height, depth) "
						   << "(" << copy_params.m_width << "," << copy_params.m_height << "," << copy_params.m_depth
						   << ")\n"
						   << tcu::TestLog::EndMessage;

		test_passed = false;
	}

	gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
}